

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

QString * __thiscall
ProjectBuilderMakefileGenerator::findProgram
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,ProString *prog)

{
  QString file;
  char cVar1;
  bool bVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::toQString(__return_storage_ptr__,prog);
  cVar1 = QDir::isRelativePath((QString *)__return_storage_ptr__);
  if (cVar1 != '\0') {
    local_58.size = 0xaaaaaaaaaaaaaaaa;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    qgetenv((char *)&local_90);
    QString::QString((QString *)&local_78,(QByteArray *)&local_90);
    lVar3 = 0;
    QString::split(&local_58,&local_78,0x3a,0,1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    for (uVar4 = 0; uVar4 < (ulong)local_58.size; uVar4 = uVar4 + 1) {
      local_78.size = -0x5555555555555556;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_90.d = (Data *)((long)&((local_58.ptr)->d).d + lVar3);
      local_90.ptr = "/";
      local_90.size = (qsizetype)prog;
      QStringBuilder<QStringBuilder<const_QString_&,_const_char_(&)[2]>,_const_ProString_&>::
      convertTo<QString>((QString *)&local_78,
                         (QStringBuilder<QStringBuilder<const_QString_&,_const_char_(&)[2]>,_const_ProString_&>
                          *)&local_90);
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      file.d.ptr = (char16_t *)this;
      file.d.d = (Data *)__return_storage_ptr__;
      file.d.size = (qsizetype)local_78.d;
      bVar2 = MakefileGenerator::exists((MakefileGenerator *)this,file);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff58);
      if (bVar2) {
        QString::operator=(__return_storage_ptr__,(QString *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        break;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      lVar3 = lVar3 + 0x18;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::findProgram(const ProString &prog)
{
    QString ret = prog.toQString();
    if(QDir::isRelativePath(ret)) {
        QStringList paths = QString(qgetenv("PATH")).split(':');
        for(int i = 0; i < paths.size(); ++i) {
            QString path = paths.at(i) + "/" + prog;
            if(exists(path)) {
                ret = path;
                break;
            }
        }
    }
    return ret;
}